

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceBase.hpp
# Opt level: O1

void __thiscall
Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>::RecycleDynamicBufferId
          (RenderDeviceBase<Diligent::EngineVkImplTraits> *this,Uint32 Id)

{
  SpinLock *this_00;
  iterator __position;
  byte bVar1;
  char (*in_R8) [54];
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar2;
  string msg;
  uint local_34;
  string local_30;
  
  this_00 = &this->m_RecycledDynamicBufferIdsLock;
  LOCK();
  bVar1 = (this->m_RecycledDynamicBufferIdsLock).m_IsLocked._M_base._M_i;
  (this->m_RecycledDynamicBufferIdsLock).m_IsLocked._M_base._M_i = true;
  UNLOCK();
  local_34 = Id;
  while ((bVar1 & 1) != 0) {
    Threading::SpinLock::Wait(this_00);
    LOCK();
    bVar1 = (this_00->m_IsLocked)._M_base._M_i;
    (this_00->m_IsLocked)._M_base._M_i = true;
    UNLOCK();
  }
  __position._M_current =
       (this->m_RecycledDynamicBufferIds).
       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_RecycledDynamicBufferIds).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)
               &this->m_RecycledDynamicBufferIds,__position,&local_34);
  }
  else {
    *__position._M_current = local_34;
    (this->m_RecycledDynamicBufferIds).
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = __position._M_current + 1;
  }
  pVar2 = std::
          _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::_M_emplace<unsigned_int&>
                    ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)&this->m_DbgRecycledDynamicBufferIds,&local_34);
  if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    FormatString<char[19],unsigned_int,char[54]>
              (&local_30,(Diligent *)"Dynamic buffer ID ",(char (*) [19])&local_34,
               (uint *)" has already been recycled. This appears to be a bug.",in_R8);
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"RecycleDynamicBufferId",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/RenderDeviceBase.hpp"
               ,0x180);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  Threading::SpinLock::unlock(this_00);
  return;
}

Assistant:

void RecycleDynamicBufferId(Uint32 Id)
    {
        Threading::SpinLockGuard Guard{m_RecycledDynamicBufferIdsLock};
        m_RecycledDynamicBufferIds.push_back(Id);
#ifdef DILIGENT_DEBUG
        VERIFY(m_DbgRecycledDynamicBufferIds.emplace(Id).second, "Dynamic buffer ID ", Id, " has already been recycled. This appears to be a bug.");
#endif
    }